

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::
ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL>::
test_shader_compilation
          (ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL> *this
          ,TestShaderType tested_shader_type)

{
  long *plVar1;
  ulong *puVar2;
  undefined1 *puVar3;
  TestError *pTVar4;
  long *plVar5;
  size_type *psVar6;
  undefined1 *puVar7;
  string *psVar8;
  undefined1 *puVar9;
  undefined1 *puVar10;
  undefined1 *puVar11;
  string *psVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  long lVar14;
  string shader_variable_declarations;
  string shader_source;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  ConstructorsAndUnsizedDeclUnsizedConstructors<glcts::ArraysOfArrays::Interface::GL> *local_220;
  string input [15];
  
  shader_variable_declarations._M_dataplus._M_p = (pointer)&shader_variable_declarations.field_2;
  local_220 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&shader_variable_declarations,
             "= float[2][1][2][1](\n        float[1][2][1](\n            float[2][1]( \n                float[1](12.3), float[1](54.2) \n            )\n        ),\n        float[1][2][1](\n            float[2][1]( \n                float[1]( 3.2), float[1]( 7.4) \n            )\n        )\n    );\n\n"
             ,"");
  input[0]._M_dataplus._M_p = (pointer)&input[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)input,"float a[2][1][2][]","");
  input[1]._M_dataplus._M_p = (pointer)&input[1].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 1),"float a[2][1][][1]","");
  input[2]._M_dataplus._M_p = (pointer)&input[2].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 2),"float a[2][1][][]","");
  input[3]._M_dataplus._M_p = (pointer)&input[3].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 3),"float a[2][][2][1]","");
  input[4]._M_dataplus._M_p = (pointer)&input[4].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 4),"float a[2][][2][]","");
  input[5]._M_dataplus._M_p = (pointer)&input[5].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 5),"float a[2][][][1]","");
  input[6]._M_dataplus._M_p = (pointer)&input[6].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 6),"float a[2][][][]","");
  input[7]._M_dataplus._M_p = (pointer)&input[7].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 7),"float a[][1][2][1]","");
  input[8]._M_dataplus._M_p = (pointer)&input[8].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 8),"float a[][1][2][]","");
  input[9]._M_dataplus._M_p = (pointer)&input[9].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 9),"float a[][1][][1]","");
  input[10]._M_dataplus._M_p = (pointer)&input[10].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 10),"float a[][1][][]","");
  input[0xb]._M_dataplus._M_p = (pointer)&input[0xb].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xb),"float a[][][2][1]","");
  input[0xc]._M_dataplus._M_p = (pointer)&input[0xc].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xc),"float a[][][2][]","");
  input[0xd]._M_dataplus._M_p = (pointer)&input[0xd].field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xd),"float a[][][][1]","");
  paVar13 = &input[0xe].field_2;
  input[0xe]._M_dataplus._M_p = (pointer)paVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)(input + 0xe),"float a[][][][]","");
  lVar14 = 8;
  do {
    __str._M_dataplus._M_p = (pointer)&__str.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__str,shader_start_abi_cxx11_,DAT_02233658 + shader_start_abi_cxx11_);
    std::__cxx11::string::append((char *)&__str);
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&__str,*(ulong *)((long)input + lVar14 + -8));
    plVar5 = plVar1 + 2;
    if ((long *)*plVar1 == plVar5) {
      local_230 = *plVar5;
      lStack_228 = plVar1[3];
      local_240 = &local_230;
    }
    else {
      local_230 = *plVar5;
      local_240 = (long *)*plVar1;
    }
    local_238 = plVar1[1];
    *plVar1 = (long)plVar5;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    plVar1 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_240,
                                (ulong)shader_variable_declarations._M_dataplus._M_p);
    psVar6 = (size_type *)(plVar1 + 2);
    if ((size_type *)*plVar1 == psVar6) {
      shader_source.field_2._M_allocated_capacity = *psVar6;
      shader_source.field_2._8_8_ = plVar1[3];
      shader_source._M_dataplus._M_p = (pointer)&shader_source.field_2;
    }
    else {
      shader_source.field_2._M_allocated_capacity = *psVar6;
      shader_source._M_dataplus._M_p = (pointer)*plVar1;
    }
    shader_source._M_string_length = plVar1[1];
    *plVar1 = (long)psVar6;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    if (local_240 != &local_230) {
      operator_delete(local_240,local_230 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)__str._M_dataplus._M_p != &__str.field_2) {
      operator_delete(__str._M_dataplus._M_p,__str.field_2._M_allocated_capacity + 1);
    }
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Unrecognized shader type.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x847);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    puVar2 = &set_tesseation_abi_cxx11_;
    switch(tested_shader_type) {
    case VERTEX_SHADER_TYPE:
      std::__cxx11::string::append((char *)&shader_source);
      break;
    case GEOMETRY_SHADER_TYPE:
      puVar2 = &emit_quad_abi_cxx11_;
    case TESSELATION_CONTROL_SHADER_TYPE:
      std::__cxx11::string::_M_append((char *)&shader_source,*puVar2);
    }
    std::__cxx11::string::_M_append((char *)&shader_source,shader_end_abi_cxx11_);
    if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x84a);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    psVar8 = &shader_source;
    puVar10 = empty_string_abi_cxx11_;
    puVar9 = empty_string_abi_cxx11_;
    puVar7 = empty_string_abi_cxx11_;
    puVar3 = (undefined1 *)psVar8;
    puVar11 = empty_string_abi_cxx11_;
    psVar12 = (string *)empty_string_abi_cxx11_;
    switch(tested_shader_type) {
    case FRAGMENT_SHADER_TYPE:
      puVar3 = empty_string_abi_cxx11_;
      puVar10 = default_vertex_shader_source_abi_cxx11_;
      puVar9 = default_tc_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      puVar11 = default_geometry_shader_source_abi_cxx11_;
      psVar12 = psVar8;
      break;
    case VERTEX_SHADER_TYPE:
      puVar9 = default_tc_shader_source_abi_cxx11_;
      puVar10 = (undefined1 *)psVar8;
      goto LAB_00b5ff3a;
    case GEOMETRY_SHADER_TYPE:
      puVar10 = default_vertex_shader_source_abi_cxx11_;
      puVar9 = default_tc_shader_source_abi_cxx11_;
      puVar7 = (undefined1 *)&default_te_shader_source_abi_cxx11_;
      goto LAB_00b5ff7b;
    case TESSELATION_CONTROL_SHADER_TYPE:
      puVar9 = (undefined1 *)psVar8;
      puVar10 = default_vertex_shader_source_abi_cxx11_;
LAB_00b5ff3a:
      psVar8 = (string *)&default_te_shader_source_abi_cxx11_;
LAB_00b5ff74:
      puVar7 = (undefined1 *)psVar8;
      psVar8 = (string *)default_geometry_shader_source_abi_cxx11_;
LAB_00b5ff7b:
      puVar3 = empty_string_abi_cxx11_;
      puVar11 = (undefined1 *)psVar8;
      psVar12 = (string *)default_fragment_shader_source_abi_cxx11_;
      break;
    case TESSELATION_EVALUATION_SHADER_TYPE:
      puVar10 = default_vertex_shader_source_abi_cxx11_;
      puVar9 = default_tc_shader_source_abi_cxx11_;
      goto LAB_00b5ff74;
    }
    (*(local_220->super_TestCaseBase<glcts::ArraysOfArrays::Interface::GL>).super_TestCase.
      super_TestNode._vptr_TestNode[10])(local_220,puVar10,puVar9,puVar7,puVar11,psVar12,puVar3,1,0)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)shader_source._M_dataplus._M_p != &shader_source.field_2) {
      operator_delete(shader_source._M_dataplus._M_p,shader_source.field_2._M_allocated_capacity + 1
                     );
    }
    lVar14 = lVar14 + 0x20;
    if (lVar14 == 0x1e8) {
      lVar14 = -0x1e0;
      do {
        plVar1 = (long *)(((string *)(paVar13 + -1))->_M_dataplus)._M_p;
        if (paVar13 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar1) {
          operator_delete(plVar1,paVar13->_M_allocated_capacity + 1);
        }
        paVar13 = paVar13 + -2;
        lVar14 = lVar14 + 0x20;
      } while (lVar14 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)shader_variable_declarations._M_dataplus._M_p != &shader_variable_declarations.field_2)
      {
        operator_delete(shader_variable_declarations._M_dataplus._M_p,
                        shader_variable_declarations.field_2._M_allocated_capacity + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void ConstructorsAndUnsizedDeclUnsizedConstructors<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string shader_variable_declarations = "= float[2][1][2][1](\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1](12.3), float[1](54.2) \n"
											   "            )\n"
											   "        ),\n"
											   "        float[1][2][1](\n"
											   "            float[2][1]( \n"
											   "                float[1]( 3.2), float[1]( 7.4) \n"
											   "            )\n"
											   "        )\n"
											   "    );\n\n";

	std::string input[] = { "float a[2][1][2][]", "float a[2][1][][1]", "float a[2][1][][]", "float a[2][][2][1]",
							"float a[2][][2][]",  "float a[2][][][1]",  "float a[2][][][]",  "float a[][1][2][1]",
							"float a[][1][2][]",  "float a[][1][][1]",  "float a[][1][][]",  "float a[][][2][1]",
							"float a[][][2][]",   "float a[][][][1]",   "float a[][][][]" };

	for (size_t string_index = 0; string_index < sizeof(input) / sizeof(input[0]); string_index++)
	{
		std::string shader_source = shader_start + "    " + input[string_index] + shader_variable_declarations;

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
	} /* for (int string_index = 0; ...) */
}